

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtility.cpp
# Opt level: O1

int __thiscall TestSuit::run(TestSuit *this)

{
  pointer pTVar1;
  bool bVar2;
  ostream *poVar3;
  long *plVar4;
  char *pcVar5;
  pointer pTVar6;
  undefined1 auVar7 [12];
  
  (*this->_vptr_TestSuit[2])();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of test cases: ",0x16);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pTVar6 = (this->tests).super__Vector_base<TestFunction,_std::allocator<TestFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->tests).super__Vector_base<TestFunction,_std::allocator<TestFunction>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    bVar2 = pTVar6 != pTVar1;
    if (!bVar2) {
LAB_00104c21:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"All tests passed.",0x11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
      std::ostream::put('\x18');
      std::ostream::flush();
      return 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(pTVar6->name)._M_dataplus._M_p,
                        (pTVar6->name)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((pTVar6->func).super__Function_base._M_manager == (_Manager_type)0x0) {
      auVar7 = std::__throw_bad_function_call();
      if (auVar7._8_4_ != 1) {
        _Unwind_Resume(auVar7._0_8_);
      }
      plVar4 = (long *)__cxa_begin_catch(auVar7._0_8_);
      (*this->_vptr_TestSuit[3])();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"test failed.",0xc);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      pcVar5 = (char *)(**(code **)(*plVar4 + 0x10))(plVar4);
      poVar3 = std::operator<<((ostream *)&std::cerr,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar3);
      __cxa_end_catch();
      if (bVar2) {
        return -1;
      }
      goto LAB_00104c21;
    }
    (*(pTVar6->func)._M_invoker)((_Any_data *)&pTVar6->func);
    pTVar6 = pTVar6 + 1;
  } while( true );
}

Assistant:

int TestSuit::run()
{
    setup();
    std::cout << "Number of test cases: " << tests.size() << std::endl;

    for (auto& test : tests)
    {
        std::cout << "Testing " << test.name << std::endl;

        try
        {
            test.func();
        }
        catch (std::exception& e)
        {
            on_failed();
            std::cerr << "test failed." << std::endl;
            std::cerr << e.what() << std::endl;
            return -1;
        }
    }

    std::cout << "All tests passed." << std::endl;
    return 0;
}